

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  ulong uVar1;
  string_view view;
  string_view view_00;
  string_view view_01;
  string_view view_02;
  bool bVar2;
  size_type sVar3;
  const_reference pcVar4;
  size_type sVar5;
  long lVar6;
  bool local_149;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  size_type local_100;
  size_t end;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  const_pointer local_b8;
  const_pointer local_b0;
  string_view local_a8;
  const_pointer local_98;
  const_pointer local_90;
  string_view local_88;
  const_pointer local_78;
  const_pointer local_70;
  string_view local_68;
  const_pointer local_58;
  const_pointer local_50;
  undefined1 local_48 [8];
  string_view open_str;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_type local_18;
  size_t open_start;
  Lexer *this_local;
  
  this->m_tok_start = this->m_pos;
  open_start = (size_t)this;
LAB_001c1060:
  do {
    uVar1 = this->m_tok_start;
    sVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
    if (sVar3 <= uVar1) {
      make_token(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
    switch(this->m_state) {
    case ExpressionStart:
      this->m_state = ExpressionBody;
      lVar6 = std::__cxx11::string::size();
      this->m_pos = lVar6 + this->m_pos;
      make_token(__return_storage_ptr__,this,ExpressionOpen);
      return __return_storage_ptr__;
    case ExpressionBody:
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_d8,
                 &this->m_config->expression_close);
      scan_body(__return_storage_ptr__,this,local_d8,ExpressionClose);
      return __return_storage_ptr__;
    case LineStart:
      this->m_state = LineBody;
      lVar6 = std::__cxx11::string::size();
      this->m_pos = lVar6 + this->m_pos;
      make_token(__return_storage_ptr__,this,LineStatementOpen);
      return __return_storage_ptr__;
    case LineBody:
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"\n");
      scan_body(__return_storage_ptr__,this,local_e8,LineStatementClose);
      return __return_storage_ptr__;
    case StatementStart:
      this->m_state = StatementBody;
      lVar6 = std::__cxx11::string::size();
      this->m_pos = lVar6 + this->m_pos;
      make_token(__return_storage_ptr__,this,StatementOpen);
      return __return_storage_ptr__;
    case StatementBody:
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&end,
                 &this->m_config->statement_close);
      scan_body(__return_storage_ptr__,this,_end,StatementClose);
      return __return_storage_ptr__;
    case CommentStart:
      this->m_state = CommentBody;
      lVar6 = std::__cxx11::string::size();
      this->m_pos = lVar6 + this->m_pos;
      make_token(__return_storage_ptr__,this,CommentOpen);
      return __return_storage_ptr__;
    case CommentBody:
      local_110 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&this->m_in,this->m_pos,0xffffffffffffffff);
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_120,
                 &this->m_config->comment_close);
      sVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_110,local_120,0);
      local_100 = sVar5;
      if (sVar5 == 0xffffffffffffffff) {
        sVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        ;
        this->m_pos = sVar3;
        make_token(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      this->m_state = Text;
      lVar6 = std::__cxx11::string::size();
      this->m_pos = sVar5 + lVar6 + this->m_pos;
      make_token(__return_storage_ptr__,this,CommentClose);
      return __return_storage_ptr__;
    }
    local_28 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&this->m_in,this->m_pos,0xffffffffffffffff);
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,std::char_traits<char>> *)&open_str.size_,
               &this->m_config->open_chars);
    local_18 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         (&local_28,stack0xffffffffffffffc8,0);
    if (local_18 == 0xffffffffffffffff) {
      sVar3 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
      this->m_pos = sVar3;
      make_token(__return_storage_ptr__,this,Text);
      return __return_storage_ptr__;
    }
    this->m_pos = local_18 + this->m_pos;
    _local_48 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&this->m_in,this->m_pos,0xffffffffffffffff);
    local_58 = (const_pointer)local_48;
    local_50 = open_str.data_;
    nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
    basic_string_view<std::allocator<char>>
              ((basic_string_view<char,std::char_traits<char>> *)&local_68,
               &this->m_config->expression_open);
    view_02.size_ = (size_type)local_50;
    view_02.data_ = local_58;
    bVar2 = string_view::starts_with(view_02,local_68);
    if (bVar2) {
      this->m_state = ExpressionStart;
    }
    else {
      local_78 = (const_pointer)local_48;
      local_70 = open_str.data_;
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,std::char_traits<char>> *)&local_88,
                 &this->m_config->statement_open);
      view_01.size_ = (size_type)local_70;
      view_01.data_ = local_78;
      bVar2 = string_view::starts_with(view_01,local_88);
      if (bVar2) {
        this->m_state = StatementStart;
      }
      else {
        local_98 = (const_pointer)local_48;
        local_90 = open_str.data_;
        nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
        basic_string_view<std::allocator<char>>
                  ((basic_string_view<char,std::char_traits<char>> *)&local_a8,
                   &this->m_config->comment_open);
        view_00.size_ = (size_type)local_90;
        view_00.data_ = local_98;
        bVar2 = string_view::starts_with(view_00,local_a8);
        if (bVar2) {
          this->m_state = CommentStart;
        }
        else {
          if (this->m_pos == 0) {
LAB_001c12e9:
            local_b8 = (const_pointer)local_48;
            local_b0 = open_str.data_;
            nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
            basic_string_view<std::allocator<char>>
                      ((basic_string_view<char,std::char_traits<char>> *)&local_c8,
                       &this->m_config->line_statement);
            view.size_ = (size_type)local_b0;
            view.data_ = local_b8;
            local_149 = string_view::starts_with(view,local_c8);
          }
          else {
            pcVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->m_pos - 1);
            local_149 = false;
            if (*pcVar4 == '\n') goto LAB_001c12e9;
          }
          if (local_149 == false) {
            this->m_pos = this->m_pos + 1;
            goto LAB_001c1060;
          }
          this->m_state = LineStart;
        }
      }
    }
    if (this->m_pos != this->m_tok_start) {
      make_token(__return_storage_ptr__,this,Text);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token scan() {
		m_tok_start = m_pos;

	again:
		if (m_tok_start >= m_in.size()) return make_token(Token::Kind::Eof);

		switch (m_state) {
			default:
			case State::Text: {
				// fast-scan to first open character
				size_t open_start = m_in.substr(m_pos).find_first_of(m_config.open_chars);
				if (open_start == nonstd::string_view::npos) {
					// didn't find open, return remaining text as text token
					m_pos = m_in.size();
					return make_token(Token::Kind::Text);
				}
				m_pos += open_start;

				// try to match one of the opening sequences, and get the close
				nonstd::string_view open_str = m_in.substr(m_pos);
				if (inja::string_view::starts_with(open_str, m_config.expression_open)) {
					m_state = State::ExpressionStart;
				} else if (inja::string_view::starts_with(open_str, m_config.statement_open)) {
					m_state = State::StatementStart;
				} else if (inja::string_view::starts_with(open_str, m_config.comment_open)) {
					m_state = State::CommentStart;
				} else if ((m_pos == 0 || m_in[m_pos - 1] == '\n') &&
						   inja::string_view::starts_with(open_str, m_config.line_statement)) {
					m_state = State::LineStart;
				} else {
					m_pos += 1;  // wasn't actually an opening sequence
					goto again;
				}
				if (m_pos == m_tok_start) goto again;  // don't generate empty token
				return make_token(Token::Kind::Text);
			}
			case State::ExpressionStart: {
				m_state = State::ExpressionBody;
				m_pos += m_config.expression_open.size();
				return make_token(Token::Kind::ExpressionOpen);
			}
			case State::LineStart: {
				m_state = State::LineBody;
				m_pos += m_config.line_statement.size();
				return make_token(Token::Kind::LineStatementOpen);
			}
			case State::StatementStart: {
				m_state = State::StatementBody;
				m_pos += m_config.statement_open.size();
				return make_token(Token::Kind::StatementOpen);
			}
			case State::CommentStart: {
				m_state = State::CommentBody;
				m_pos += m_config.comment_open.size();
				return make_token(Token::Kind::CommentOpen);
			}
			case State::ExpressionBody:
				return scan_body(m_config.expression_close, Token::Kind::ExpressionClose);
			case State::LineBody:
				return scan_body("\n", Token::Kind::LineStatementClose);
			case State::StatementBody:
				return scan_body(m_config.statement_close, Token::Kind::StatementClose);
			case State::CommentBody: {
				// fast-scan to comment close
				size_t end = m_in.substr(m_pos).find(m_config.comment_close);
				if (end == nonstd::string_view::npos) {
					m_pos = m_in.size();
					return make_token(Token::Kind::Eof);
				}
				// return the entire comment in the close token
				m_state = State::Text;
				m_pos += end + m_config.comment_close.size();
				return make_token(Token::Kind::CommentClose);
			}
		}
	}